

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O0

int Pf_ManPrepareCuts(Pf_Cut_t *pCuts,Pf_Man_t *p,int iObj,int fAddUnit)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  word wVar5;
  int *pList;
  int *pCut;
  Pf_Cut_t *pPStack_30;
  int i;
  Pf_Cut_t *pMfCut;
  int fAddUnit_local;
  int iObj_local;
  Pf_Man_t *p_local;
  Pf_Cut_t *pCuts_local;
  
  iVar1 = Pf_ObjHasCuts(p,iObj);
  if (iVar1 == 0) {
    pCuts_local._4_4_ = Pf_CutCreateUnit(pCuts,iObj);
  }
  else {
    piVar4 = Pf_ObjCutSet(p,iObj);
    pCut._4_4_ = 0;
    pList = piVar4 + 1;
    pPStack_30 = pCuts;
    while (pCut._4_4_ < *piVar4) {
      pPStack_30->Delay = 0;
      pPStack_30->Flow = 0.0;
      uVar2 = Pf_CutFunc(pList);
      *(uint *)&pPStack_30->field_0x10 =
           *(uint *)&pPStack_30->field_0x10 & 0xfc000000 | uVar2 & 0x3ffffff;
      iVar1 = Pf_CutSize(pList);
      *(uint *)&pPStack_30->field_0x10 =
           *(uint *)&pPStack_30->field_0x10 & 0x7ffffff | iVar1 << 0x1b;
      iVar1 = Pf_CutSize(pList);
      wVar5 = Pf_CutGetSign(pList + 1,iVar1);
      pPStack_30->Sign = wVar5;
      iVar1 = Abc_Lit2Var(*(uint *)&pPStack_30->field_0x10 & 0x3ffffff);
      uVar2 = Pf_ObjCutUseless(p,iVar1);
      *(uint *)&pPStack_30->field_0x10 =
           *(uint *)&pPStack_30->field_0x10 & 0xfbffffff | (uVar2 & 1) << 0x1a;
      iVar1 = Pf_CutSize(pList);
      memcpy(pPStack_30->pLeaves,pList + 1,(long)iVar1 << 2);
      pPStack_30 = pPStack_30 + 1;
      pCut._4_4_ = pCut._4_4_ + 1;
      iVar1 = Pf_CutSize(pList);
      pList = pList + (iVar1 + 1);
    }
    if ((fAddUnit == 0) || (*(uint *)&pCuts->field_0x10 >> 0x1b < 2)) {
      pCuts_local._4_4_ = *piVar4;
    }
    else {
      iVar1 = *piVar4;
      iVar3 = Pf_CutCreateUnit(pPStack_30,iObj);
      pCuts_local._4_4_ = iVar1 + iVar3;
    }
  }
  return pCuts_local._4_4_;
}

Assistant:

static inline int Pf_ManPrepareCuts( Pf_Cut_t * pCuts, Pf_Man_t * p, int iObj, int fAddUnit )
{
    if ( Pf_ObjHasCuts(p, iObj) )
    {
        Pf_Cut_t * pMfCut = pCuts;
        int i, * pCut, * pList = Pf_ObjCutSet(p, iObj);
        Pf_SetForEachCut( pList, pCut, i )
        {
            pMfCut->Delay   = 0;
            pMfCut->Flow    = 0;
            pMfCut->iFunc   = Pf_CutFunc( pCut );
            pMfCut->nLeaves = Pf_CutSize( pCut );
            pMfCut->Sign    = Pf_CutGetSign( pCut+1, Pf_CutSize(pCut) );
            pMfCut->Useless = Pf_ObjCutUseless( p, Abc_Lit2Var(pMfCut->iFunc) );
            memcpy( pMfCut->pLeaves, pCut+1, sizeof(int) * Pf_CutSize(pCut) );
            pMfCut++;
        }
        if ( fAddUnit && pCuts->nLeaves > 1 )
            return pList[0] + Pf_CutCreateUnit( pMfCut, iObj );
        return pList[0];
    }
    return Pf_CutCreateUnit( pCuts, iObj );
}